

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

void Diligent::FormatStrSS<std::__cxx11::stringstream,unsigned_int>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               MemorySizeFormatter<unsigned_int> *Arg)

{
  long lVar1;
  uint uVar2;
  ostream *poVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  
  uVar4 = Arg->size;
  uVar2 = uVar4;
  if (Arg->ref_size != 0) {
    uVar2 = Arg->ref_size;
  }
  if (uVar2 < 0x40000000) {
    if (uVar2 < 0x100000) {
      if (uVar2 < 0x400) {
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)(ss + 0x10));
        uVar4 = Arg->size & 1;
        pcVar6 = " Byte";
        if (uVar4 == 0) {
          pcVar6 = " Bytes";
        }
        lVar5 = 6 - (ulong)uVar4;
        goto LAB_002749d2;
      }
      lVar5 = *(long *)(ss + 0x10);
      lVar1 = *(long *)(lVar5 + -0x18);
      *(uint *)(ss + lVar1 + 0x28) = *(uint *)(ss + lVar1 + 0x28) & 0xfffffefb | 4;
      *(long *)(ss + *(long *)(lVar5 + -0x18) + 0x18) = (long)Arg->precision;
      poVar3 = std::ostream::_M_insert<double>((double)uVar4 * 0.0009765625);
      pcVar6 = " KB";
    }
    else {
      lVar5 = *(long *)(ss + 0x10);
      lVar1 = *(long *)(lVar5 + -0x18);
      *(uint *)(ss + lVar1 + 0x28) = *(uint *)(ss + lVar1 + 0x28) & 0xfffffefb | 4;
      *(long *)(ss + *(long *)(lVar5 + -0x18) + 0x18) = (long)Arg->precision;
      poVar3 = std::ostream::_M_insert<double>((double)uVar4 * 9.5367431640625e-07);
      pcVar6 = " MB";
    }
  }
  else {
    lVar5 = *(long *)(ss + 0x10);
    lVar1 = *(long *)(lVar5 + -0x18);
    *(uint *)(ss + lVar1 + 0x28) = *(uint *)(ss + lVar1 + 0x28) & 0xfffffefb | 4;
    *(long *)(ss + *(long *)(lVar5 + -0x18) + 0x18) = (long)Arg->precision;
    poVar3 = std::ostream::_M_insert<double>((double)uVar4 * 9.313225746154785e-10);
    pcVar6 = " GB";
  }
  lVar5 = 3;
LAB_002749d2:
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar5);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const MemorySizeFormatter<Type>& Arg)
{
    auto ref_size = Arg.ref_size != 0 ? Arg.ref_size : Arg.size;
    if (ref_size >= (1 << 30))
    {
        ss << std::fixed << std::setprecision(Arg.precision) << static_cast<double>(Arg.size) / double{1 << 30} << " GB";
    }
    else if (ref_size >= (1 << 20))
    {
        ss << std::fixed << std::setprecision(Arg.precision) << static_cast<double>(Arg.size) / double{1 << 20} << " MB";
    }
    else if (ref_size >= (1 << 10))
    {
        ss << std::fixed << std::setprecision(Arg.precision) << static_cast<double>(Arg.size) / double{1 << 10} << " KB";
    }
    else
    {
        ss << Arg.size << (((Arg.size & 0x01) == 0x01) ? " Byte" : " Bytes");
    }
}